

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzDDD::ArchiveOUT(ChNodeFEAxyzDDD *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::fea::ChNodeFEAxyzDD>(marchive);
  ChNodeFEAxyzDD::ArchiveOUT(&this->super_ChNodeFEAxyzDD,marchive);
  local_38._value = (ChVector<double> *)&(this->super_ChNodeFEAxyzDD).field_0x190;
  local_38._name = "DDD";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->DDD_dt;
  local_38._name = "DDD_dt";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->DDD_dtdt;
  local_38._name = "DDD_dtdt";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  return;
}

Assistant:

void ChNodeFEAxyzDDD::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChNodeFEAxyzDD>();
    // serialize parent class
    ChNodeFEAxyzDD::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(DDD);
    marchive << CHNVP(DDD_dt);
    marchive << CHNVP(DDD_dtdt);
}